

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void enlist_str(CVmObjList *lst,int idx,date_parse_string *str)

{
  vm_val_t local_20;
  
  if (str->p == (char *)0x0) {
    local_20.typ = VM_NIL;
  }
  else {
    local_20.val.obj = CVmObjString::create(0,str->p,str->len);
    local_20.typ = VM_OBJ;
  }
  CVmObjList::cons_set_element(lst,(long)idx,&local_20);
  return;
}

Assistant:

static void enlist_str(VMG_ CVmObjList *lst, int idx,
                       const date_parse_string &str)
{
    enlist_str(vmg_ lst, idx, str.p, str.len);
}